

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_flags nk_chart_push_slot(nk_context *ctx,float value,int slot)

{
  nk_chart_type nVar1;
  nk_window *win_00;
  nk_window *win;
  nk_flags flags;
  int slot_local;
  float value_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4efb,"nk_flags nk_chart_push_slot(struct nk_context *, float, int)");
  }
  if (ctx->current != (nk_window *)0x0) {
    if ((-1 < slot) && (slot < 4)) {
      if (slot < (ctx->current->layout->chart).slot) {
        if (((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) || (3 < slot)) {
          ctx_local._4_4_ = 0;
        }
        else if (slot < (ctx->current->layout->chart).slot) {
          win_00 = ctx->current;
          if ((win_00->layout->chart).slot < slot) {
            ctx_local._4_4_ = 0;
          }
          else {
            nVar1 = (win_00->layout->chart).slots[slot].type;
            if (nVar1 == NK_CHART_LINES) {
              win._4_4_ = nk_chart_push_line(ctx,win_00,&win_00->layout->chart,value,slot);
            }
            else if (nVar1 == NK_CHART_COLUMN) {
              win._4_4_ = nk_chart_push_column(ctx,win_00,&win_00->layout->chart,value,slot);
            }
            else {
              win._4_4_ = 0;
            }
            ctx_local._4_4_ = win._4_4_;
          }
        }
        else {
          ctx_local._4_4_ = 0;
        }
        return ctx_local._4_4_;
      }
      __assert_fail("slot < ctx->current->layout->chart.slot",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x4efe,"nk_flags nk_chart_push_slot(struct nk_context *, float, int)");
    }
    __assert_fail("slot >= 0 && slot < 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4efd,"nk_flags nk_chart_push_slot(struct nk_context *, float, int)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x4efc,"nk_flags nk_chart_push_slot(struct nk_context *, float, int)");
}

Assistant:

NK_API nk_flags
nk_chart_push_slot(struct nk_context *ctx, float value, int slot)
{
    nk_flags flags;
    struct nk_window *win;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(slot >= 0 && slot < NK_CHART_MAX_SLOT);
    NK_ASSERT(slot < ctx->current->layout->chart.slot);
    if (!ctx || !ctx->current || slot >= NK_CHART_MAX_SLOT) return nk_false;
    if (slot >= ctx->current->layout->chart.slot) return nk_false;

    win = ctx->current;
    if (win->layout->chart.slot < slot) return nk_false;
    switch (win->layout->chart.slots[slot].type) {
    case NK_CHART_LINES:
        flags = nk_chart_push_line(ctx, win, &win->layout->chart, value, slot); break;
    case NK_CHART_COLUMN:
        flags = nk_chart_push_column(ctx, win, &win->layout->chart, value, slot); break;
    default:
    case NK_CHART_MAX:
        flags = 0;
    }
    return flags;
}